

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O0

void __thiscall MeterPrivate::drawScale(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  qsizetype *this_00;
  qreal aleft;
  DrawParams *lhs;
  DrawParams *pDVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double local_c8;
  int local_bc;
  double dStack_b8;
  int i_1;
  qreal scaleStepInDegree_1;
  double dStack_a8;
  int stepsCount_1;
  int local_9c;
  double dStack_98;
  int i;
  qreal scaleStepInDegree;
  qreal fullStepsCount;
  int stepsCount;
  undefined1 local_78 [8];
  QVector<qreal> alreadyDrawn;
  QRectF local_40;
  DrawParams *local_20;
  DrawParams *params_local;
  QPainter *painter_local;
  MeterPrivate *this_local;
  
  local_20 = params;
  params_local = (DrawParams *)painter;
  painter_local = (QPainter *)this;
  QPainter::save();
  QPainter::setPen((QColor *)params_local);
  pDVar1 = params_local;
  lhs = local_20;
  aleft = local_20->margin;
  this_00 = &alreadyDrawn.d.size;
  QMarginsF::QMarginsF((QMarginsF *)this_00,aleft,aleft,aleft,aleft);
  operator-(&local_40,&lhs->rect,(QMarginsF *)this_00);
  QPainter::drawArc((QRectF *)pDVar1,(int)&local_40,
                    (int)((-90.0 - local_20->startScaleAngle) * 16.0));
  QPainter::translate((QPainter *)params_local,(double)this->radius,(double)this->radius);
  QPainter::rotate(local_20->startScaleAngle);
  QList<double>::QList((QList<double> *)local_78);
  QList<double>::append((QList<double> *)local_78,local_20->startScaleAngle);
  if (this->scaleGridStep <= 0.0) {
    QPainter::drawLine((QPainter *)params_local,0,(int)((double)this->radius - local_20->margin),0,
                       (int)(((double)this->radius - local_20->gridLabelSize) - local_20->margin));
    QPainter::rotate(local_20->scaleDegree);
    QList<double>::append((QList<double> *)local_78,local_20->scaleDegree);
    QPainter::drawLine((QPainter *)params_local,0,(int)((double)this->radius - local_20->margin),0,
                       (int)(((double)this->radius - local_20->gridLabelSize) - local_20->margin));
  }
  else {
    fullStepsCount._0_4_ = (int)((this->maxValue - this->minValue) / this->scaleGridStep);
    scaleStepInDegree = (this->maxValue - this->minValue) / this->scaleGridStep;
    dStack_98 = (local_20->scaleDegree / (this->maxValue - this->minValue)) * this->scaleGridStep;
    for (local_9c = 0; local_9c <= fullStepsCount._0_4_; local_9c = local_9c + 1) {
      QPainter::drawLine((QPainter *)params_local,0,(int)((double)this->radius - local_20->margin),0
                         ,(int)(((double)this->radius - local_20->gridLabelSize) - local_20->margin)
                        );
      QPainter::rotate(dStack_98);
      QList<double>::append
                ((QList<double> *)local_78,(double)local_9c * dStack_98 + local_20->startScaleAngle)
      ;
    }
    dStack_a8 = scaleStepInDegree - (double)fullStepsCount._0_4_;
    dVar4 = qAbs<double>(&stack0xffffffffffffff58);
    if (1e-06 < dVar4) {
      QPainter::restore();
      QPainter::save();
      QPainter::translate((QPainter *)params_local,(double)this->radius,(double)this->radius);
      QPainter::rotate(local_20->startScaleAngle + local_20->scaleDegree);
      QPainter::setPen((QColor *)params_local);
      QPainter::drawLine((QPainter *)params_local,0,(int)((double)this->radius - local_20->margin),0
                         ,(int)(((double)this->radius - local_20->gridLabelSize) - local_20->margin)
                        );
      QList<double>::append
                ((QList<double> *)local_78,local_20->startScaleAngle + local_20->scaleDegree);
    }
  }
  QPainter::restore();
  if (0.0 < this->scaleStep) {
    QPainter::save();
    QPainter::setPen((QColor *)params_local);
    QPainter::translate((QPainter *)params_local,(double)this->radius,(double)this->radius);
    QPainter::rotate(local_20->startScaleAngle);
    iVar3 = (int)((this->maxValue - this->minValue) / this->scaleStep);
    dStack_b8 = local_20->scaleDegree / (double)iVar3;
    scaleStepInDegree_1._4_4_ = iVar3 + -2;
    QPainter::rotate(dStack_b8);
    for (local_bc = 0; local_bc <= scaleStepInDegree_1._4_4_; local_bc = local_bc + 1) {
      local_c8 = (double)local_bc * dStack_b8 + local_20->startScaleAngle + dStack_b8;
      bVar2 = QListSpecialMethodsBase<double>::contains<double>
                        ((QListSpecialMethodsBase<double> *)local_78,&local_c8);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        QPainter::drawLine((QPainter *)params_local,0,(int)((double)this->radius - local_20->margin)
                           ,0,(int)(((double)this->radius - local_20->scaleWidth) - local_20->margin
                                   ));
      }
      QPainter::rotate(dStack_b8);
    }
    QPainter::restore();
  }
  QList<double>::~QList((QList<double> *)local_78);
  return;
}

Assistant:

void
MeterPrivate::drawScale( QPainter & painter, DrawParams & params )
{
	painter.save();
	painter.setPen( textColor );
	painter.drawArc( params.rect -
	QMarginsF( params.margin, params.margin, params.margin, params.margin ),
		( -90.0 - params.startScaleAngle ) * 16, -params.scaleDegree * 16 );
	painter.translate( radius, radius );
	painter.rotate( params.startScaleAngle );

	QVector< qreal > alreadyDrawn;
	alreadyDrawn.append( params.startScaleAngle );

	if( scaleGridStep > 0.0 )
	{
		const int stepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		const qreal fullStepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		const qreal scaleStepInDegree = params.scaleDegree / ( maxValue - minValue ) * scaleGridStep;

		for( int i = 0; i <= stepsCount; ++i )
		{
			painter.drawLine( 0, radius - params.margin, 0,
				radius - params.gridLabelSize - params.margin );
			painter.rotate( scaleStepInDegree );
			alreadyDrawn.append( params.startScaleAngle + i * scaleStepInDegree );
		}

		if( qAbs( fullStepsCount - stepsCount ) > 0.000001 )
		{
			painter.restore();

			painter.save();

			painter.translate( radius, radius );
			painter.rotate( params.startScaleAngle + params.scaleDegree );
			painter.setPen( textColor );

			painter.drawLine( 0, radius - params.margin, 0,
				radius - params.gridLabelSize - params.margin );

			alreadyDrawn.append( params.startScaleAngle + params.scaleDegree );
		}
	}
	else
	{
		painter.drawLine( 0, radius - params.margin, 0,
			radius - params.gridLabelSize - params.margin );

		painter.rotate( params.scaleDegree );

		alreadyDrawn.append( params.scaleDegree );

		painter.drawLine( 0, radius - params.margin, 0,
			radius - params.gridLabelSize - params.margin );
	}

	painter.restore();

	if( scaleStep > 0.0 )
	{
		painter.save();
		painter.setPen( textColor );
		painter.translate( radius, radius );
		painter.rotate( params.startScaleAngle );

		int stepsCount = ( ( maxValue - minValue ) / scaleStep );
		const qreal scaleStepInDegree = params.scaleDegree / stepsCount;

		stepsCount -= 2;

		painter.rotate( scaleStepInDegree );

		for( int i = 0; i <= stepsCount; ++i )
		{
			if( !alreadyDrawn.contains( ( params.startScaleAngle + scaleStepInDegree )
				+ i * scaleStepInDegree ) )
					painter.drawLine( 0, radius - params.margin, 0,
						radius - params.scaleWidth - params.margin );

			painter.rotate( scaleStepInDegree );
		}

		painter.restore();
	}
}